

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqualityProxy.cpp
# Opt level: O1

void __thiscall Shell::EqualityProxy::apply(EqualityProxy *this,UnitList **units)

{
  List<Kernel::Unit_*> **ppLVar1;
  UnitList *pUVar2;
  Clause *cl;
  Clause *pCVar3;
  
  ppLVar1 = units;
  for (pUVar2 = *units; pUVar2 != (UnitList *)0x0; pUVar2 = pUVar2->_tail) {
    pUVar2 = *ppLVar1;
    cl = (Clause *)pUVar2->_head;
    pCVar3 = apply(this,cl);
    if (cl != pCVar3) {
      pUVar2->_head = &pCVar3->super_Unit;
    }
    ppLVar1 = &pUVar2->_tail;
  }
  addAxioms(this,units);
  return;
}

Assistant:

void EqualityProxy::apply(UnitList*& units)
{
  UnitList::DelIterator uit(units);
  while (uit.hasNext()) {
    Unit* unit = uit.next();
    ASS (unit->isClause());
    Clause* cl = static_cast<Clause*>(unit);
    Clause* cl2 = apply(cl);
    if (cl != cl2) {
      uit.replace(cl2);
    }
  }

  addAxioms(units);
}